

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int GetScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistance,double *pAngle,BOOL *pbNewScan,int *pQuality)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  double dVar4;
  int iVar5;
  ssize_t sVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_490;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  byte local_438 [3];
  ushort local_435 [514];
  
  iVar5 = clock_getres(4,&local_450);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_480), iVar5 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  uVar12 = 0;
  memset(local_438,0,0x400);
  iVar5 = (pRPLIDAR->RS232Port).DevType;
  iVar8 = 1;
  pcVar7 = "Error reading data from a RPLIDAR. ";
  if (iVar5 - 1U < 4) {
    iVar5 = (pRPLIDAR->RS232Port).s;
    do {
      sVar6 = recv(iVar5,local_438 + uVar12,(ulong)(5 - (int)uVar12),0);
      if ((int)sVar6 < 1) goto LAB_001a8da4;
      uVar13 = (int)uVar12 + (int)sVar6;
      uVar12 = (ulong)uVar13;
    } while ((int)uVar13 < 5);
  }
  else {
    if (iVar5 != 0) goto LAB_001a8dab;
    iVar5 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar12 = 0;
    do {
      sVar6 = read(iVar5,local_438 + uVar12,(ulong)(5 - (int)uVar12));
      if ((int)sVar6 < 1) goto LAB_001a8da4;
      uVar13 = (int)uVar12 + (int)sVar6;
      uVar12 = (ulong)uVar13;
    } while (uVar13 < 5);
  }
  uVar13 = 5;
  do {
    uVar14 = 4;
    if ((int)uVar13 < 4) {
      uVar14 = uVar13;
    }
    uVar11 = 1;
    if (1 < (int)uVar13) {
      uVar11 = uVar13;
    }
    lVar9 = 0;
    do {
      if (uVar13 - uVar14 == (int)lVar9) {
        uVar11 = uVar13 - uVar14;
        uVar14 = 5 - uVar14;
        goto LAB_001a8c07;
      }
      bVar1 = local_438[lVar9];
      *pbNewScan = bVar1 & 1;
      pcVar7 = "Warning : RPLIDAR bad inversed start bit. ";
      if ((bVar1 >> 1 & 1) != (byte)(bVar1 & 1)) {
        bVar2 = local_438[lVar9 + 1];
        pcVar7 = "Warning : RPLIDAR bad check bit. ";
        if ((bVar2 & 1) != 0) {
          *pQuality = (uint)(bVar1 >> 2);
          uVar3 = *(ushort *)(local_438 + lVar9 + 3);
          dVar4 = fmod(((double)(int)-((uint)(bVar2 >> 1) | (uint)local_438[lVar9 + 2] << 7) *
                        0.015625 * 3.141592653589793) / 180.0,6.283185307179586);
          dVar4 = fmod(dVar4 + 9.42477796076938,6.283185307179586);
          *pAngle = dVar4 + -3.141592653589793;
          *pDistance = (double)uVar3 / 4000.0;
          iVar8 = 0;
          if ((int)(uVar13 - (int)lVar9) < 6) {
            return 0;
          }
          pcVar7 = "Warning getting data from a RPLIDAR : Unexpected data after a data response. ";
          goto LAB_001a8dab;
        }
      }
      puts(pcVar7);
      lVar9 = lVar9 + 1;
    } while (uVar11 != (uint)lVar9);
    uVar14 = 5;
    if ((int)uVar11 < 5) {
      uVar14 = uVar11;
    }
LAB_001a8c07:
    __n = (size_t)(int)(uVar13 - uVar11);
    memmove(local_438,local_438 + (int)uVar11,__n);
    uVar13 = (uVar13 - uVar11) + uVar14;
    if (0x3ff < (int)uVar13) {
      iVar8 = 4;
      pcVar7 = "Error reading data from a RPLIDAR : Invalid data. ";
      goto LAB_001a8dab;
    }
    iVar5 = (pRPLIDAR->RS232Port).DevType;
    if (iVar5 - 1U < 4) {
      iVar5 = (pRPLIDAR->RS232Port).s;
      uVar12 = 0;
      do {
        sVar6 = recv(iVar5,local_438 + uVar12 + __n,(long)(int)(uVar14 - (int)uVar12),0);
        if ((int)sVar6 < 1) goto LAB_001a8da4;
        uVar11 = (int)uVar12 + (int)sVar6;
        uVar12 = (ulong)uVar11;
      } while ((int)uVar11 < (int)uVar14);
    }
    else {
      if (iVar5 != 0) goto LAB_001a8da4;
      iVar5 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar12 = 0;
      do {
        sVar6 = read(iVar5,local_438 + uVar12 + __n,(ulong)(uVar14 - (int)uVar12));
        if ((int)sVar6 < 1) goto LAB_001a8da4;
        uVar11 = (int)uVar12 + (int)sVar6;
        uVar12 = (ulong)uVar11;
      } while (uVar11 < uVar14);
    }
    lVar10 = local_460;
    lVar9 = lStack_458;
    if (local_440 == 0) {
      clock_gettime(4,&local_490);
      lVar10 = ((local_490.tv_sec + local_460) - local_480.tv_sec) +
               (local_490.tv_nsec + lStack_458) / 1000000000;
      lVar9 = (local_490.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (lVar9 < 0) {
        lVar10 = lVar10 + ~((ulong)-lVar9 / 1000000000);
        lVar9 = lVar9 + 1000000000 + ((ulong)-lVar9 / 1000000000) * 1000000000;
      }
    }
    iVar8 = 2;
  } while ((double)lVar9 / 1000000000.0 + (double)lVar10 <= 4.0);
  pcVar7 = "Error reading data from a RPLIDAR : Data response timeout. ";
LAB_001a8dab:
  puts(pcVar7);
  return iVar8;
LAB_001a8da4:
  iVar8 = 1;
  pcVar7 = "Error reading data from a RPLIDAR. ";
  goto LAB_001a8dab;
}

Assistant:

inline int GetScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistance, double* pAngle, BOOL* pbNewScan, int* pQuality)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[1+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[1];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = 1, j = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = (nodes[0].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);
	*pQuality = (unsigned char)(nodes[0].quality);

	// Convert in rad.
	*pAngle = fmod_2PI_deg2rad(-nodes[0].angle_z_q14*90.0/(1 << 14));

	// Convert in m.
	*pDistance = nodes[0].dist_mm_q2/4000.0;
#else
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindScanDataResponseRPLIDAR(recvbuf, BytesReceived, pbNewScan, pQuality, pAngle, pDistance, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}